

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

int spki_table_search_by_ski
              (spki_table *spki_table,uint8_t *ski,spki_record **result,uint *result_size)

{
  long lVar1;
  key_entry *key_e;
  int iVar2;
  spki_record *psVar3;
  long in_FS_OFFSET;
  key_entry *current_entry;
  void *tmp;
  tommy_node *current_node;
  uint *result_size_local;
  spki_record **result_local;
  uint8_t *ski_local;
  spki_table *spki_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *result = (spki_record *)0x0;
  *result_size = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&spki_table->lock);
  tmp = tommy_list_head(&spki_table->list);
  do {
    if (tmp == (void *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
      spki_table_local._4_4_ = 0;
LAB_001035e7:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return spki_table_local._4_4_;
      }
      __stack_chk_fail();
    }
    key_e = *(key_entry **)((long)tmp + 0x10);
    iVar2 = memcmp(key_e,ski,0x14);
    if (iVar2 == 0) {
      *result_size = *result_size + 1;
      psVar3 = (spki_record *)lrtr_realloc(*result,(ulong)*result_size << 7);
      if (psVar3 == (spki_record *)0x0) {
        lrtr_free(*result);
        pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
        spki_table_local._4_4_ = -1;
        goto LAB_001035e7;
      }
      *result = psVar3;
      key_entry_to_spki_record(key_e,*result + (*result_size - 1));
    }
    tmp = *tmp;
  } while( true );
}

Assistant:

int spki_table_search_by_ski(struct spki_table *spki_table, uint8_t *ski, struct spki_record **result,
			     unsigned int *result_size)
{
	tommy_node *current_node;
	void *tmp;
	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	current_node = tommy_list_head(&spki_table->list);
	while (current_node) {
		struct key_entry *current_entry;

		current_entry = (struct key_entry *)current_node->data;

		if (memcmp(current_entry->ski, ski, sizeof(current_entry->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, sizeof(**result) * (*result_size));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(current_entry, *result + (*result_size - 1));
		}
		current_node = current_node->next;
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}